

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O1

int Vec_IntPushUniqueOrderCost(Vec_Int_t *p,int Entry,Vec_Int_t *vCost)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int *piVar4;
  long lVar5;
  int iVar6;
  
  uVar1 = p->nSize;
  if (0 < (long)(int)uVar1) {
    lVar5 = 0;
    do {
      if (p->pArray[lVar5] == Entry) {
        return uVar1;
      }
      lVar5 = lVar5 + 1;
    } while ((int)uVar1 != lVar5);
  }
  uVar2 = p->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (p->pArray == (int *)0x0) {
        piVar4 = (int *)malloc(0x40);
      }
      else {
        piVar4 = (int *)realloc(p->pArray,0x40);
      }
      p->pArray = piVar4;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar2 * 2;
      if (iVar6 <= (int)uVar2) goto LAB_0067a099;
      if (p->pArray == (int *)0x0) {
        piVar4 = (int *)malloc((ulong)uVar2 << 3);
      }
      else {
        piVar4 = (int *)realloc(p->pArray,(ulong)uVar2 << 3);
      }
      p->pArray = piVar4;
    }
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p->nCap = iVar6;
  }
LAB_0067a099:
  lVar5 = (long)p->nSize;
  p->nSize = p->nSize + 1;
  if (0 < lVar5) {
    piVar4 = p->pArray;
    do {
      iVar6 = piVar4[lVar5 + -1];
      if (((((long)iVar6 < 0) || (vCost->nSize <= iVar6)) || (Entry < 0)) || (vCost->nSize <= Entry)
         ) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vCost->pArray[iVar6] <= vCost->pArray[(uint)Entry]) goto LAB_0067a0e9;
      piVar4[lVar5] = iVar6;
      bVar3 = 1 < lVar5;
      lVar5 = lVar5 + -1;
    } while (bVar3);
    lVar5 = 0;
  }
LAB_0067a0e9:
  p->pArray[(int)lVar5] = Entry;
  return (int)lVar5;
}

Assistant:

static inline int Vec_IntPushUniqueOrderCost( Vec_Int_t * p, int Entry, Vec_Int_t * vCost )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            return 1;
    Vec_IntPushOrderCost( p, Entry, vCost );
    return 0;
}